

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token * __thiscall Token::get_lexeme_abi_cxx11_(Token *this)

{
  string *in_RSI;
  Token *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

string Token::get_lexeme()
{
	return this->lexeme;
}